

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O3

void __thiscall
ON_HistoryRecord::RemapObjectIds(ON_HistoryRecord *this,ON_SimpleArray<ON_UuidPair> *id_remap)

{
  undefined8 *puVar1;
  ON_UUID *pOVar2;
  VALUE_TYPE VVar3;
  ON_Value *pOVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  if (0 < id_remap->m_count) {
    ON_UuidList::RemapUuids(&this->m_antecedents,id_remap);
    ON_UuidList::RemapUuids(&this->m_descendants,id_remap);
    if (0 < (this->m_value).m_count) {
      lVar8 = 0;
      do {
        pOVar4 = (this->m_value).m_a[lVar8];
        if (pOVar4 != (ON_Value *)0x0) {
          VVar3 = pOVar4->m_value_type;
          if (VVar3 == objref_value) {
            if (0 < *(int *)&pOVar4[2]._vptr_ON_Value) {
              lVar10 = 0;
              lVar9 = 0;
              do {
                ON_ObjRef::RemapObjectId
                          ((ON_ObjRef *)(*(long *)&pOVar4[1].m_value_id + lVar10),id_remap);
                lVar9 = lVar9 + 1;
                lVar10 = lVar10 + 0xe0;
              } while (lVar9 < *(int *)&pOVar4[2]._vptr_ON_Value);
            }
          }
          else if (VVar3 == uuid_value) {
            if (0 < *(int *)&pOVar4[2]._vptr_ON_Value) {
              lVar10 = 0;
              lVar9 = 0;
              do {
                uVar6 = ON_SimpleArray<ON_UuidPair>::BinarySearch
                                  (id_remap,(ON_UuidPair *)(*(long *)&pOVar4[1].m_value_id + lVar10)
                                   ,ON_UuidPair::CompareFirstUuid);
                if (-1 < (int)uVar6) {
                  pOVar2 = id_remap->m_a[uVar6].m_uuid + 1;
                  uVar5 = *(undefined8 *)pOVar2->Data4;
                  puVar1 = (undefined8 *)(*(long *)&pOVar4[1].m_value_id + lVar10);
                  *puVar1 = *(undefined8 *)pOVar2;
                  puVar1[1] = uVar5;
                }
                lVar9 = lVar9 + 1;
                lVar10 = lVar10 + 0x10;
              } while (lVar9 < *(int *)&pOVar4[2]._vptr_ON_Value);
            }
          }
          else if ((VVar3 == polyedge_value) &&
                  (iVar7 = *(int *)&pOVar4[2]._vptr_ON_Value, 0 < iVar7)) {
            lVar10._0_4_ = pOVar4[1].m_value_id;
            lVar10._4_4_ = pOVar4[1].m_value_type;
            lVar9 = 0;
            do {
              lVar13 = lVar9 * 0x78;
              if (0 < *(int *)(lVar10 + 0x10 + lVar13)) {
                lVar12 = 0;
                lVar11 = 0;
                do {
                  ON_ObjRef::RemapObjectId
                            ((ON_ObjRef *)(*(long *)(lVar10 + 8 + lVar13) + lVar12),id_remap);
                  lVar11 = lVar11 + 1;
                  lVar10 = *(long *)&pOVar4[1].m_value_id;
                  lVar12 = lVar12 + 0x158;
                } while (lVar11 < *(int *)(lVar10 + 0x10 + lVar13));
                iVar7 = *(int *)&pOVar4[2]._vptr_ON_Value;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < iVar7);
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->m_value).m_count);
    }
  }
  return;
}

Assistant:

void ON_HistoryRecord::RemapObjectIds( const ON_SimpleArray<ON_UuidPair>& id_remap )
{
  if ( id_remap.Count() > 0 )
  {
    int i, j;
    m_antecedents.RemapUuids(id_remap);
    m_descendants.RemapUuids(id_remap);
    for ( i = 0; i < m_value.Count(); i++ )
    {
      ON_Value* v = m_value[i];
      if ( v && ON_Value::objref_value == v->m_value_type )
      {
        ON_ObjRefValue* objrev_v = static_cast<ON_ObjRefValue*>(v);
        for ( j = 0; j < objrev_v->m_value.Count(); j++ )
        {
          objrev_v->m_value[j].RemapObjectId(id_remap);
        }
      }
      // 24 May 2021, Mikko, RH-56171:
      // Some commands like Offset use an UUID list to map inputs and outputs.
      // Similar to remapping the objref ids, the uuid lists also need to be
      // updated to use new ids.
      // Other commands that currently use UUID lists are Divide, Slab, Ribbon, 
      // FilletSrf, ChamferSrf, ArrayCrv, Hatch.
      else if (v && ON_Value::uuid_value == v->m_value_type)
      {
        ON_UuidValue* uuid_v = static_cast<ON_UuidValue*>(v);
        for (j = 0; j < uuid_v->m_value.Count(); j++)
        {
          int index = id_remap.BinarySearch((const ON_UuidPair*)&uuid_v->m_value[j], ON_UuidPair::CompareFirstUuid);
          if (index >= 0)
            uuid_v->m_value[j] = id_remap[index].m_uuid[1];
        }
      }
      // 27 Oct 2021, Mikko, RH-66102:
      // Polyedge values contain objrefs and also need remapping.
      // This fixes history replay not working properly on BlendSrf and others
      // when importing/pasting.
      else if (v && ON_Value::polyedge_value == v->m_value_type)
      {
        ON_PolyEdgeHistoryValue* objrev_v = static_cast<ON_PolyEdgeHistoryValue*>(v);
        for (j = 0; j < objrev_v->m_value.Count(); j++)
        {
          int k;
          for (k = 0; k < objrev_v->m_value[j].m_segment.Count(); k++)
          {
            objrev_v->m_value[j].m_segment[k].m_curve_ref.RemapObjectId(id_remap);
          }
        }
      }
    }
  }
}